

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ru_pairing.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
RU_pairing<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>
::_remove_last(RU_pairing<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>
               *this,Pos_index eventIndex)

{
  bool bVar1;
  reference pvVar2;
  pointer ppVar3;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_30;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_28;
  iterator it;
  value_type *bar;
  Pos_index nullDeath;
  Pos_index eventIndex_local;
  RU_pairing<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_true>_>_>
  *this_local;
  
  bar._0_4_ = 0xffffffff;
  bar._4_4_ = eventIndex;
  _nullDeath = this;
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->indexToBar_,(ulong)eventIndex);
  it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>)
       std::
       vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
       ::operator[](&this->barcode_,(ulong)*pvVar2);
  if ((((__node_type *)
       it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur)->
      super__Hash_node_value<std::pair<const_unsigned_int,_unsigned_int>,_false>).
      super__Hash_node_value_base<std::pair<const_unsigned_int,_unsigned_int>_>._M_storage.
      _M_storage.__align == (anon_struct_4_0_00000001_for___align)0xffffffff) {
    std::
    vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
    ::pop_back(&this->barcode_);
  }
  else {
    (((__node_type *)
     it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur)->
    super__Hash_node_value<std::pair<const_unsigned_int,_unsigned_int>,_false>).
    super__Hash_node_value_base<std::pair<const_unsigned_int,_unsigned_int>_>._M_storage._M_storage.
    __align = (anon_struct_4_0_00000001_for___align)0xffffffff;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back(&this->indexToBar_);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
       ::find((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               *)this,(key_type *)((long)&bar + 4));
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
       ::end((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
              *)this);
  bVar1 = std::__detail::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::operator->
                       ((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false> *
                        )&local_28);
    std::
    unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
    ::erase(&this->idToPosition_,&ppVar3->second);
    std::
    unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
    ::erase((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             *)this,(iterator)local_28._M_cur);
  }
  return;
}

Assistant:

void _remove_last(Pos_index eventIndex) {
    static_assert(Master_matrix::Option_list::has_removable_columns, "_remove_last not available.");
    constexpr const Pos_index nullDeath = Master_matrix::template get_null_value<Pos_index>();

    if constexpr (Master_matrix::hasFixedBarcode) {
      auto& bar = barcode_[indexToBar_[eventIndex]];
      if (bar.death == nullDeath) {  // birth
        barcode_.pop_back();  // sorted by birth and eventIndex has to be the highest one
      } else {                // death
        bar.death = nullDeath;
      };
      indexToBar_.pop_back();
    } else {  // birth order eventually shuffled by vine updates. No sort possible to keep the matchings.
      auto it = indexToBar_.find(eventIndex);
      typename Barcode::iterator bar = it->second;

      if (bar->death == nullDeath)
        barcode_.erase(bar);
      else
        bar->death = nullDeath;

      indexToBar_.erase(it);
    }

    auto it = PIDM::map_.find(eventIndex);
    if (it != PIDM::map_.end()){
      idToPosition_.erase(it->second);
      PIDM::map_.erase(it);
    }
  }